

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zetMetricCreateFromProgrammableExp2
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,uint32_t parameterCount,
          zet_metric_programmable_param_value_exp_t *pParameterValues,char *pName,char *pDescription
          ,uint32_t *pMetricHandleCount,zet_metric_handle_t *phMetricHandles)

{
  ze_result_t zVar1;
  ulong uVar2;
  
  if (DAT_0010e820 != (code *)0x0) {
    zVar1 = (*DAT_0010e820)();
    return zVar1;
  }
  if ((phMetricHandles != (zet_metric_handle_t *)0x0) && (*pMetricHandleCount != 0)) {
    uVar2 = 0;
    do {
      context_t::get()::count = context_t::get()::count + 1;
      phMetricHandles[uVar2] = context_t::get()::count;
      uVar2 = uVar2 + 1;
    } while (uVar2 < *pMetricHandleCount);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricCreateFromProgrammableExp2(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateFromProgrammableExp2 = context.zetDdiTable.MetricExp.pfnCreateFromProgrammableExp2;
        if( nullptr != pfnCreateFromProgrammableExp2 )
        {
            result = pfnCreateFromProgrammableExp2( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phMetricHandles ) && ( i < *pMetricHandleCount ); ++i )
                phMetricHandles[ i ] = reinterpret_cast<zet_metric_handle_t>( context.get() );

        }

        return result;
    }